

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

byte * __thiscall slang::BumpAllocator::allocate(BumpAllocator *this,size_t size,size_t alignment)

{
  Segment *pSVar1;
  Segment *pSVar2;
  Segment *pSVar3;
  byte *pbVar4;
  byte *pbVar5;
  
  pbVar5 = (byte *)(-alignment & (ulong)(this->head->current + (alignment - 1)));
  pbVar4 = pbVar5 + size;
  if (pbVar4 <= this->endPtr) {
    this->head->current = pbVar4;
    return pbVar5;
  }
  if (0x800 < size) {
    pSVar1 = this->head;
    pSVar3 = pSVar1->prev;
    pSVar2 = (Segment *)malloc(((alignment + size) - 1 & -alignment) + 0x10);
    pSVar2->prev = pSVar3;
    pSVar2->current = (byte *)(pSVar2 + 1);
    pSVar1->prev = pSVar2;
    return (byte *)((long)&pSVar2->current + alignment + 7 & -alignment);
  }
  pSVar1 = this->head;
  pSVar3 = (Segment *)malloc(0x1000);
  pSVar3->prev = pSVar1;
  pSVar3->current = (byte *)(pSVar3 + 1);
  this->head = pSVar3;
  this->endPtr = (byte *)(pSVar3 + 0x100);
  pbVar4 = allocate(this,size,alignment);
  return pbVar4;
}

Assistant:

byte* allocate(size_t size, size_t alignment) {
        byte* base = alignPtr(head->current, alignment);
        byte* next = base + size;
        if (next > endPtr)
            return allocateSlow(size, alignment);

        head->current = next;
        return base;
    }